

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walWriteOneFrame(WalWriter *p,PgHdr *pPage,int nTruncate,sqlite3_int64 iOffset)

{
  u32 *aIn;
  Pgno PVar1;
  u8 *a;
  Wal *pWVar2;
  int iVar3;
  uint uVar4;
  u8 aFrame [24];
  
  a = (u8 *)pPage->pData;
  pWVar2 = p->pWal;
  PVar1 = pPage->pgno;
  aIn = (pWVar2->hdr).aFrameCksum;
  aFrame[0] = (u8)(PVar1 >> 0x18);
  aFrame[1] = (u8)(PVar1 >> 0x10);
  aFrame[2] = (u8)(PVar1 >> 8);
  aFrame[3] = (u8)PVar1;
  aFrame[4] = (u8)((uint)nTruncate >> 0x18);
  aFrame[5] = (u8)((uint)nTruncate >> 0x10);
  aFrame[6] = (u8)((uint)nTruncate >> 8);
  aFrame[7] = (u8)nTruncate;
  aFrame._8_8_ = *(undefined8 *)(pWVar2->hdr).aSalt;
  uVar4 = (uint)((pWVar2->hdr).bigEndCksum == '\0');
  walChecksumBytes(uVar4,aFrame,8,aIn,aIn);
  walChecksumBytes(uVar4,a,pWVar2->szPage,aIn,aIn);
  uVar4 = (pWVar2->hdr).aFrameCksum[0];
  aFrame._16_4_ = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = (pWVar2->hdr).aFrameCksum[1];
  aFrame._20_4_ = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  iVar3 = walWriteToLog(p,aFrame,0x18,iOffset);
  if (iVar3 == 0) {
    iVar3 = walWriteToLog(p,a,p->szPage,iOffset + 0x18);
  }
  return iVar3;
}

Assistant:

static int walWriteOneFrame(
  WalWriter *p,               /* Where to write the frame */
  PgHdr *pPage,               /* The page of the frame to be written */
  int nTruncate,              /* The commit flag.  Usually 0.  >0 for commit */
  sqlite3_int64 iOffset       /* Byte offset at which to write */
){
  int rc;                         /* Result code from subfunctions */
  void *pData;                    /* Data actually written */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-header in */
#if defined(SQLITE_HAS_CODEC)
  if( (pData = sqlite3PagerCodec(pPage))==0 ) return SQLITE_NOMEM;
#else
  pData = pPage->pData;
#endif
  walEncodeFrame(p->pWal, pPage->pgno, nTruncate, pData, aFrame);
  rc = walWriteToLog(p, aFrame, sizeof(aFrame), iOffset);
  if( rc ) return rc;
  /* Write the page data */
  rc = walWriteToLog(p, pData, p->szPage, iOffset+sizeof(aFrame));
  return rc;
}